

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDitheringTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles2::Functional::DitheringCase::checkColor
          (DitheringCase *this,Vec4 *inputClr,RGBA *renderedClr,bool logErrors)

{
  ostringstream *poVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  MessageBuilder *pMVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  float __x;
  float fVar14;
  float fVar15;
  vector<int,_std::allocator<int>_> channelChoices;
  undefined1 *local_3a0;
  undefined8 local_398;
  undefined1 local_390 [16];
  RGBA *local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined1 local_368 [16];
  string local_350;
  MessageBuilder local_330;
  MessageBuilder local_1b0;
  
  local_378._0_4_ = (this->m_renderFormat).redBits;
  local_378._4_4_ = (this->m_renderFormat).greenBits;
  uStack_370._0_4_ = (this->m_renderFormat).blueBits;
  uStack_370._4_4_ = (this->m_renderFormat).alphaBits;
  bVar3 = true;
  lVar9 = 0;
  local_380 = renderedClr;
  while( true ) {
    if (lVar9 == 4) {
      return bVar3;
    }
    iVar6 = *(int *)((long)&local_378 + lVar9 * 4);
    if (iVar6 != 0) break;
LAB_00398750:
    lVar9 = lVar9 + 1;
  }
  iVar12 = 1 << ((byte)iVar6 & 0x1f);
  iVar6 = iVar12 + -1;
  __x = (float)iVar6 * inputClr->m_data[lVar9];
  fVar14 = floorf(__x + 0.5);
  channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fVar15 = ceilf(__x);
  iVar11 = (int)fVar15;
  iVar4 = iVar11;
  if (iVar6 < iVar11) {
    iVar4 = iVar6;
  }
  local_330.m_log._0_4_ = iVar4;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&channelChoices,(int *)&local_330);
  iVar4 = iVar11 + -1;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  local_330.m_log = (TestLog *)CONCAT44(local_330.m_log._4_4_,iVar4);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&channelChoices,(int *)&local_330);
  fVar15 = __x - fVar14;
  uVar13 = -(uint)(-fVar15 <= fVar15);
  fVar15 = (float)(~uVar13 & (uint)-fVar15 | (uint)fVar15 & uVar13);
  local_368 = ZEXT416((uint)fVar15);
  if (fVar15 < 0.0001) {
    if (__x <= fVar14) {
      local_330.m_log = (TestLog *)CONCAT44(local_330.m_log._4_4_,iVar11 + 1);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&channelChoices,(int *)&local_330);
    }
    else {
      local_330.m_log = (TestLog *)CONCAT44(local_330.m_log._4_4_,iVar11 + -2);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&channelChoices,(int *)&local_330);
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  tcu::RGBA::toIVec((RGBA *)&local_330);
  fVar14 = floorf((float)(iVar6 * *(int *)((long)&local_330.m_log + lVar9 * 4)) / 255.0 + 0.5);
  uVar7 = (ulong)((long)channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar8 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    uVar8 = 0;
  }
  uVar7 = 0;
LAB_0039848d:
  if (uVar8 != uVar7) goto code_r0x00398492;
  if (logErrors) {
    local_1b0.m_log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    std::operator<<((ostream *)&local_1b0.m_str,"Failure: ");
    pMVar5 = tcu::MessageBuilder::operator<<(&local_1b0,(int *)((long)&local_378 + lVar9 * 4));
    std::operator<<((ostream *)&pMVar5->m_str,"-bit ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char **)(s_channelNames + lVar9 * 8));
    poVar1 = &pMVar5->m_str;
    std::operator<<((ostream *)poVar1," channel is ");
    std::ostream::operator<<(poVar1,(int)fVar14);
    std::operator<<((ostream *)poVar1,", should be ");
    local_3a0 = local_390;
    local_398 = 0;
    local_390[0] = 0;
    lVar10 = 0;
    for (uVar7 = 0;
        iVar6 = (int)((ulong)((long)channelChoices.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)channelChoices.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2),
        (long)uVar7 < (long)iVar6; uVar7 = uVar7 + 1) {
      if ((uVar7 == iVar6 - 1) || (lVar10 != 0)) {
        std::__cxx11::string::append((char *)&local_3a0);
      }
      de::toString<int>(&local_350,
                        (int *)((long)channelChoices.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar10));
      std::__cxx11::string::append((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_350);
      lVar10 = lVar10 + 4;
    }
    std::operator<<((ostream *)poVar1,(string *)&local_3a0);
    std::operator<<((ostream *)poVar1," (corresponding fragment color channel is ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,inputClr->m_data + lVar9);
    std::operator<<((ostream *)&pMVar5->m_str,")");
    local_330.m_log =
         tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330.m_str);
    std::operator<<((ostream *)&local_330.m_str,"Note: ");
    pMVar5 = tcu::MessageBuilder::operator<<(&local_330,inputClr->m_data + lVar9);
    poVar1 = &pMVar5->m_str;
    std::operator<<((ostream *)poVar1," * (");
    std::ostream::operator<<(poVar1,iVar12);
    std::operator<<((ostream *)poVar1,"-1) = ");
    std::ostream::operator<<(poVar1,__x);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330.m_str);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
    if ((float)local_368._0_4_ < 0.0001) {
      local_330.m_log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330.m_str);
      std::operator<<((ostream *)&local_330.m_str,
                      "Note: one extra color candidate was allowed because fragmentColorChannel * (2^bits-1) is close to an integer"
                     );
      tcu::MessageBuilder::operator<<(&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330.m_str);
    }
  }
  bVar3 = false;
LAB_00398739:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&channelChoices.super__Vector_base<int,_std::allocator<int>_>);
  goto LAB_00398750;
code_r0x00398492:
  piVar2 = channelChoices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + uVar7;
  uVar7 = uVar7 + 1;
  if (*piVar2 == (int)fVar14) goto LAB_00398739;
  goto LAB_0039848d;
}

Assistant:

bool DitheringCase::checkColor (const Vec4& inputClr, const tcu::RGBA& renderedClr, const bool logErrors) const
{
	const IVec4		channelBits		= pixelFormatToIVec4(m_renderFormat);
	bool			allChannelsOk	= true;

	for (int chanNdx = 0; chanNdx < 4; chanNdx++)
	{
		if (channelBits[chanNdx] == 0)
			continue;

		const int		channelMax			= (1 << channelBits[chanNdx]) - 1;
		const float		scaledInput			= inputClr[chanNdx] * (float)channelMax;
		const bool		useRoundingMargin	= deFloatAbs(scaledInput - deFloatRound(scaledInput)) < 0.0001f;
		vector<int>		channelChoices;

		channelChoices.push_back(de::min(channelMax,	(int)deFloatCeil(scaledInput)));
		channelChoices.push_back(de::max(0,				(int)deFloatCeil(scaledInput) - 1));

		// If the input color results in a scaled value that is very close to an integer, account for a little bit of possible inaccuracy.
		if (useRoundingMargin)
		{
			if (scaledInput > deFloatRound(scaledInput))
				channelChoices.push_back((int)deFloatCeil(scaledInput) - 2);
			else
				channelChoices.push_back((int)deFloatCeil(scaledInput) + 1);
		}

		std::sort(channelChoices.begin(), channelChoices.end());

		{
			const int		renderedClrInFormat	= (int)deFloatRound((float)(renderedClr.toIVec()[chanNdx] * channelMax) / 255.0f);
			bool			goodChannel			= false;

			for (int i = 0; i < (int)channelChoices.size(); i++)
			{
				if (renderedClrInFormat == channelChoices[i])
				{
					goodChannel = true;
					break;
				}
			}

			if (!goodChannel)
			{
				if (logErrors)
				{
					m_testCtx.getLog() << TestLog::Message
									   << "Failure: " << channelBits[chanNdx] << "-bit " << s_channelNames[chanNdx] << " channel is " << renderedClrInFormat
									   << ", should be " << choiceListStr(channelChoices)
									   << " (corresponding fragment color channel is " << inputClr[chanNdx] << ")"
									   << TestLog::EndMessage
									   << TestLog::Message
									   << "Note: " << inputClr[chanNdx] << " * (" << channelMax + 1 << "-1) = " << scaledInput
									   << TestLog::EndMessage;

					if (useRoundingMargin)
					{
						m_testCtx.getLog() << TestLog::Message
										   << "Note: one extra color candidate was allowed because fragmentColorChannel * (2^bits-1) is close to an integer"
										   << TestLog::EndMessage;
					}
				}

				allChannelsOk = false;
			}
		}
	}

	return allChannelsOk;
}